

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSAOHDist_NECOF.cpp
# Opt level: O2

double __thiscall
FSAOHDist_NECOF::GetXOHProb_relT_SufficientSFscope
          (FSAOHDist_NECOF *this,Scope *sfSc,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sfacIndices,Scope *agSc,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *ohIndices)

{
  uint uVar1;
  Index IVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  const_reference ppuVar5;
  const_reference ppCVar6;
  ulong __n;
  uint uVar7;
  ulong __n_00;
  double in_XMM0_Qa;
  double local_248;
  string s;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sfacIrestr;
  stringstream ss;
  
  (*(this->super_FactoredStateAOHDistribution)._vptr_FactoredStateAOHDistribution[5])();
  uVar7 = 0;
  local_248 = in_XMM0_Qa;
  while( true ) {
    __n_00 = (ulong)uVar7;
    if ((ulong)((long)(agSc->super_SDT).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(agSc->super_SDT).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= __n_00) break;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&agSc->super_SDT,__n_00);
    __n = (ulong)*pvVar3;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(ohIndices,__n_00);
    uVar1 = *pvVar3;
    pvVar4 = std::vector<Scope,_std::allocator<Scope>_>::at(&this->_m_sfacSoI,__n);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &sfacIrestr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
               (long)(pvVar4->super_SDT).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar4->super_SDT).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,(allocator_type *)&ss);
    pvVar4 = std::vector<Scope,_std::allocator<Scope>_>::at(&this->_m_sfacSoI,__n);
    IndexTools::RestrictIndividualIndicesToNarrowerScope<unsigned_int>
              (sfacIndices,sfSc,pvVar4,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &sfacIrestr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    ppuVar5 = std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::at
                        (&this->_m_stepsize,__n);
    IVar2 = IndexTools::IndividualToJointIndicesStepSize
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &sfacIrestr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                       *ppuVar5);
    ppCVar6 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::at
                        (&this->_m_oHistConditional,__n);
    (*(*ppCVar6)->_vptr_CPDDiscreteInterface[2])(*ppCVar6,(ulong)uVar1,(ulong)IVar2);
    local_248 = local_248 * in_XMM0_Qa;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&sfacIrestr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    uVar7 = uVar7 + 1;
  }
  return local_248;
}

Assistant:

double FSAOHDist_NECOF::GetXOHProb_relT_SufficientSFscope(
        const Scope& sfSc, const std::vector<Index>& sfacIndices,
        const Scope& agSc, const std::vector<Index>& ohIndices
        ) const
{    
    double p = GetXProb(sfSc, sfacIndices);


    for(Index i=0; i < agSc.size(); i++)
    {
        Index agI=agSc.at(i);
        Index ohI=ohIndices.at(i);

        vector<Index> sfacIrestr(_m_sfacSoI.at(agI).size());
        try{
            IndexTools::RestrictIndividualIndicesToNarrowerScope(
                sfacIndices, sfSc, _m_sfacSoI.at(agI), sfacIrestr );
        }catch(ENoSubScope& e)
        {
            stringstream ss;
            ss <<"Error FSAOHDist_NECOF::GetXOHProb_relT should be called with all state factors on which the observation histories (of the agents in agSc) depend\n";
            ss <<"sfSc="<<sfSc<<", agSc="<<agSc<<endl;
            string s(ss.str());
            cerr << s;
            throw ENoSubScope(s);
        }
        Index x = IndexTools::IndividualToJointIndicesStepSize(sfacIrestr, 
                _m_stepsize.at(agI) );

        double p_i = _m_oHistConditional.at(agI)->Get(ohI, x);
        p *= p_i;
    }

    return p;

}